

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<slang::Diagnostic>::
emplace_back<slang::ast::Symbol_const&,slang::DiagCode&,slang::SourceLocation&>
          (SmallVectorBase<slang::Diagnostic> *this,Symbol *args,DiagCode *args_1,
          SourceLocation *args_2)

{
  undefined8 *puVar1;
  DiagCode DVar2;
  SourceLocation SVar3;
  size_type sVar4;
  ulong uVar5;
  Diagnostic *__result;
  reference __result_00;
  move_iterator<slang::Diagnostic_*> __last;
  move_iterator<slang::Diagnostic_*> __last_00;
  move_iterator<slang::Diagnostic_*> __first;
  ulong uVar6;
  long lVar7;
  
  __last._M_current = this->data_ + this->len;
  if (this->len != this->cap) {
    DVar2 = *args_1;
    SVar3 = *args_2;
    ((__last._M_current)->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = false;
    ((__last._M_current)->args).
    super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((__last._M_current)->args).
    super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((__last._M_current)->args).
    super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((__last._M_current)->ranges).
    super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ((__last._M_current)->ranges).
    super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ((__last._M_current)->ranges).
    super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((__last._M_current)->notes).
    super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ((__last._M_current)->notes).
    super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ((__last._M_current)->notes).
    super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__last._M_current)->code = DVar2;
    (__last._M_current)->location = SVar3;
    (__last._M_current)->symbol = args;
    sVar4 = this->len;
    this->len = sVar4 + 1;
    return this->data_ + sVar4;
  }
  if (this->len == 0x124924924924924) {
    detail::throwLengthError();
  }
  uVar6 = this->len + 1;
  uVar5 = this->cap;
  if (uVar6 < uVar5 * 2) {
    uVar6 = uVar5 * 2;
  }
  if (0x124924924924924 - uVar5 < uVar5) {
    uVar6 = 0x124924924924924;
  }
  lVar7 = (long)__last._M_current - (long)this->data_;
  __result = (Diagnostic *)operator_new(uVar6 * 0x70);
  DVar2 = *args_1;
  SVar3 = *args_2;
  *(undefined1 *)((long)__result + lVar7 + 0x50) = 0;
  *(undefined8 *)((long)__result + lVar7) = 0;
  ((undefined8 *)((long)__result + lVar7))[1] = 0;
  puVar1 = (undefined8 *)((long)__result + lVar7 + 0x10);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1 = (undefined8 *)((long)__result + lVar7 + 0x20);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1 = (undefined8 *)((long)__result + lVar7 + 0x30);
  *puVar1 = 0;
  puVar1[1] = 0;
  *(undefined8 *)((long)__result + lVar7 + 0x40) = 0;
  *(DiagCode *)((long)__result + lVar7 + 0x58) = DVar2;
  *(SourceLocation *)((long)__result + lVar7 + 0x60) = SVar3;
  *(Symbol **)((long)__result + lVar7 + 0x68) = args;
  __first._M_current = this->data_;
  __last_00._M_current = __first._M_current + this->len;
  __result_00 = __result;
  if (__last_00._M_current != __last._M_current) {
    std::__uninitialized_copy<false>::
    __uninit_copy<std::move_iterator<slang::Diagnostic*>,slang::Diagnostic*>
              (__first,__last,__result);
    __last_00._M_current = this->data_ + this->len;
    __result_00 = (reference)((long)__result + lVar7) + 1;
    __first._M_current = __last._M_current;
  }
  std::__uninitialized_copy<false>::
  __uninit_copy<std::move_iterator<slang::Diagnostic*>,slang::Diagnostic*>
            (__first,__last_00,__result_00);
  cleanup(this,(EVP_PKEY_CTX *)__last_00._M_current);
  this->len = this->len + 1;
  this->cap = uVar6;
  this->data_ = __result;
  return (reference)((long)__result + lVar7);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }